

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRle.cpp
# Opt level: O1

int Imf_2_5::rleCompress(int inLength,char *in,char *out)

{
  char *pcVar1;
  char cVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  int iVar6;
  char cVar7;
  char *runStart;
  char *pcVar8;
  char *pcVar9;
  long lVar10;
  long lVar11;
  char *pcVar12;
  
  iVar6 = (int)out;
  if (0 < inLength) {
    pcVar5 = in + inLength;
    pcVar8 = in;
    do {
      pcVar1 = in + 1;
      pcVar3 = in + 3;
      pcVar4 = pcVar8 + ~(ulong)in;
      lVar10 = (long)(in + 1) - (long)pcVar8;
      cVar2 = (char)in - (char)pcVar8;
      do {
        cVar7 = cVar2;
        lVar11 = lVar10;
        pcVar12 = pcVar4;
        pcVar9 = pcVar3;
        in = pcVar1;
        if ((pcVar5 <= in) || ((long)pcVar12 < -0x7f)) break;
        pcVar1 = in + 1;
        pcVar3 = pcVar9 + 1;
        pcVar4 = pcVar12 + -1;
        lVar10 = lVar11 + 1;
        cVar2 = cVar7 + '\x01';
      } while (*pcVar8 == *in);
      if (pcVar12 == (char *)0xfffffffffffffffe || -(long)pcVar12 < 2) {
        if (in < pcVar5) {
          do {
            pcVar1 = pcVar9 + -1;
            if (((pcVar1 < pcVar5) && (pcVar9[-2] == pcVar9[-1])) && (pcVar9 < pcVar5)) {
              if ((0x7e < lVar11) || (pcVar9[-1] == *pcVar9)) break;
            }
            else if (0x7e < lVar11) goto LAB_00205a3b;
            in = in + 1;
            pcVar9 = pcVar9 + 1;
            lVar11 = lVar11 + 1;
          } while (pcVar1 < pcVar5);
          in = pcVar9 + -2;
        }
LAB_00205a3b:
        *out = (char)pcVar8 - (char)in;
        out = out + 1;
        if (pcVar8 < in) {
          lVar10 = (long)in - (long)pcVar8;
          do {
            cVar2 = *pcVar8;
            pcVar8 = pcVar8 + 1;
            *out = cVar2;
            out = out + 1;
            lVar10 = lVar10 + -1;
          } while (lVar10 != 0);
        }
      }
      else {
        *out = cVar7;
        out[1] = *pcVar8;
        out = out + 2;
        pcVar8 = in;
      }
    } while (pcVar8 < pcVar5);
  }
  return (int)out - iVar6;
}

Assistant:

int
rleCompress (int inLength, const char in[], signed char out[])
{
    const char *inEnd = in + inLength;
    const char *runStart = in;
    const char *runEnd = in + 1;
    signed char *outWrite = out;

    while (runStart < inEnd)
    {
	while (runEnd < inEnd &&
	       *runStart == *runEnd &&
	       runEnd - runStart - 1 < MAX_RUN_LENGTH)
	{
	    ++runEnd;
	}

	if (runEnd - runStart >= MIN_RUN_LENGTH)
	{
	    //
	    // Compressable run
	    //

	    *outWrite++ = (runEnd - runStart) - 1;
	    *outWrite++ = *(signed char *) runStart;
	    runStart = runEnd;
	}
	else
	{
	    //
	    // Uncompressable run
	    //

	    while (runEnd < inEnd &&
		   ((runEnd + 1 >= inEnd ||
		     *runEnd != *(runEnd + 1)) ||
		    (runEnd + 2 >= inEnd ||
		     *(runEnd + 1) != *(runEnd + 2))) &&
		   runEnd - runStart < MAX_RUN_LENGTH)
	    {
		++runEnd;
	    }

	    *outWrite++ = runStart - runEnd;

	    while (runStart < runEnd)
	    {
		*outWrite++ = *(signed char *) (runStart++);
	    }
	}

	++runEnd;
    }

    return outWrite - out;
}